

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorCvodePreconditioner.cpp
# Opt level: O3

int pele::physics::reactions::cvode::Precond
              (Real param_1,N_Vector u,N_Vector param_3,int jok,int *jcurPtr,Real gamma,
              void *user_data)

{
  double dVar1;
  int iVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  realtype **a;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [12];
  int i_2;
  sunindextype sVar17;
  realtype *prVar18;
  double *pdVar19;
  long lVar20;
  double *pdVar21;
  double *pdVar22;
  int k_1;
  long lVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined8 extraout_XMM0_Qb_00;
  double dVar36;
  double dVar37;
  double dVar38;
  undefined1 auVar39 [16];
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  double dVar52;
  Real h_RT [9];
  Real c [9];
  Real c_R [9];
  Real dcRdT [9];
  Real activity [9];
  Real massfrac [9];
  double dStack_a40;
  double local_a30;
  double dStack_a20;
  double dStack_a10;
  double local_9d0;
  undefined1 local_998 [16];
  double local_988;
  double dStack_980;
  double local_978;
  double dStack_970;
  double local_968;
  double dStack_960;
  undefined8 local_958;
  double local_948;
  undefined8 uStack_940;
  double local_938;
  double dStack_930;
  undefined1 local_928 [16];
  undefined8 local_918;
  undefined8 uStack_910;
  double local_900;
  double local_8f8;
  double dStack_8f0;
  undefined1 local_8e8 [16];
  double local_8d8;
  double dStack_8d0;
  undefined1 local_8c8 [16];
  double local_8b8;
  double dStack_8b0;
  double local_8a8;
  undefined8 uStack_8a0;
  double local_898;
  undefined8 uStack_890;
  double local_888;
  double local_880;
  double local_878;
  double local_870;
  double local_868;
  double dStack_860;
  double local_858;
  double local_850;
  double dStack_848;
  double local_838;
  double dStack_830;
  double local_820;
  double local_818 [10];
  double local_7c8;
  double dStack_7c0;
  double local_7b8;
  double dStack_7b0;
  double local_7a8;
  double dStack_7a0;
  double local_798;
  double dStack_790;
  double local_788;
  double local_780;
  double local_778 [10];
  double local_728;
  double dStack_720;
  double local_718;
  double dStack_710;
  double local_708 [8];
  undefined1 *local_6c8;
  double local_6c0 [5];
  undefined1 local_698 [16];
  double local_688;
  double local_680;
  double local_668;
  double local_660;
  double dStack_658;
  double local_650;
  double local_648;
  double local_640;
  double dStack_638;
  double local_630;
  double local_618;
  double dStack_610;
  double local_608;
  double dStack_600;
  double local_5f8;
  double dStack_5f0;
  double local_5e8;
  double local_5e0;
  double local_5c8;
  double local_5c0;
  double local_5b8;
  double local_5b0;
  double local_5a8;
  double dStack_5a0;
  double local_598;
  double local_590;
  double local_578;
  double local_570;
  double dStack_568;
  double local_560;
  double dStack_558;
  double dStack_550;
  double dStack_548;
  double local_540;
  double local_528;
  double dStack_520;
  double local_518;
  undefined1 local_510 [16];
  double local_500;
  double dStack_4f8;
  double local_4f0;
  double local_4d8;
  double local_4d0;
  double local_4c8;
  double local_4c0;
  double local_4b8;
  double local_4b0;
  double dStack_4a8;
  double local_4a0;
  double local_438 [9];
  realtype local_3f0 [2];
  double local_3e0;
  double local_3d8;
  double local_3d0;
  double local_3c8;
  int local_3bc;
  double local_3b8;
  double local_3a8;
  undefined8 uStack_3a0;
  realtype local_398;
  undefined8 uStack_390;
  double local_388;
  double dStack_380;
  double local_378;
  double dStack_370;
  double local_368;
  double dStack_360;
  double local_358;
  undefined8 uStack_350;
  double local_348;
  double dStack_340;
  double local_338;
  undefined8 uStack_330;
  double local_328;
  undefined8 uStack_320;
  double local_318;
  undefined8 uStack_310;
  double local_308;
  undefined8 uStack_300;
  double local_2f8;
  undefined8 uStack_2f0;
  double local_2e8;
  undefined8 uStack_2e0;
  undefined1 local_2d8 [16];
  double local_2c8;
  double local_2c0;
  double local_2b8;
  double dStack_2b0;
  undefined1 local_2a8 [16];
  double local_298;
  double local_288 [4];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  double local_248 [2];
  double local_238;
  undefined8 uStack_230;
  double local_228;
  double local_218;
  undefined8 uStack_210;
  double local_208;
  undefined8 uStack_200;
  double local_1f8;
  double dStack_1f0;
  double local_1e8;
  double dStack_1e0;
  double local_1d8;
  double dStack_1d0;
  double local_1c8;
  double local_1c0;
  double local_1b8;
  undefined8 uStack_1b0;
  double local_1a8;
  undefined8 uStack_1a0;
  double local_198;
  undefined8 uStack_190;
  double local_188;
  realtype local_178;
  double local_168 [10];
  double local_118 [10];
  double local_c8 [10];
  undefined1 local_78 [16];
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  
  local_178 = gamma;
  prVar18 = N_VGetArrayPointer(u);
  iVar2 = *(int *)((long)user_data + 0x14);
  puVar3 = *(undefined8 **)((long)user_data + 0xb0);
  puVar4 = *(undefined8 **)((long)user_data + 0xa8);
  puVar5 = *(undefined8 **)((long)user_data + 0xb8);
  local_168[0] = 2.016;
  local_168[1] = 31.998;
  local_168[2] = 18.015;
  local_168[3] = 1.008;
  local_168[4] = 15.999;
  local_168[5] = 17.007;
  local_168[6] = 33.006;
  local_168[7] = 34.014;
  local_168[8] = 28.014;
  if (jok == 0) {
    dVar24 = 0.0;
    lVar20 = 0;
    do {
      dVar24 = dVar24 + prVar18[lVar20];
      lVar20 = lVar20 + 1;
    } while (lVar20 != 9);
    local_c8[6] = 0.0;
    local_c8[7] = 0.0;
    local_c8[4] = 0.0;
    local_c8[5] = 0.0;
    local_c8[2] = 0.0;
    local_c8[3] = 0.0;
    local_c8[0] = 0.0;
    local_c8[1] = 0.0;
    local_c8[8] = 0.0;
    lVar20 = 0;
    do {
      local_c8[lVar20] = prVar18[lVar20] * (1.0 / dVar24);
      lVar20 = lVar20 + 1;
    } while (lVar20 != 9);
    local_398 = prVar18[9];
    local_118[6] = 0.0;
    local_118[7] = 0.0;
    local_118[4] = 0.0;
    local_118[5] = 0.0;
    local_118[2] = 0.0;
    local_118[3] = 0.0;
    local_118[0] = 0.0;
    local_118[1] = 0.0;
    local_118[8] = 0.0;
    local_708[0] = 0.49603174603174605;
    local_708[1] = 0.03125195324707794;
    local_708[2] = 0.055509297807382736;
    local_708[3] = 0.9920634920634921;
    local_708[4] = 0.06250390649415588;
    local_708[5] = 0.05879931792791203;
    local_708[6] = 0.030297521662727988;
    local_708[7] = 0.029399658963956014;
    local_6c8 = &DAT_3fa246cdaf410bdd;
    lVar20 = 0;
    do {
      local_118[lVar20] = local_c8[lVar20] * dVar24 * local_708[lVar20];
      lVar20 = lVar20 + 1;
    } while (lVar20 != 9);
    local_3bc = iVar2;
    uStack_390 = 0;
    lVar20 = 0;
    do {
      local_818[lVar20] = local_118[lVar20] * 1000000.0;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 9);
    pdVar19 = local_708;
    lVar20 = 0;
    memset(pdVar19,0,800);
    local_968 = 0.0;
    dStack_960 = 0.0;
    local_978 = 0.0;
    dStack_970 = 0.0;
    local_988 = 0.0;
    dStack_980 = 0.0;
    local_998 = ZEXT816(0);
    local_958 = 0;
    dVar24 = log(local_398);
    local_1a8 = local_398 * local_398;
    local_198 = local_398 * local_1a8;
    dVar52 = 1.0 / local_398;
    dVar25 = 12186.6002121605 / local_398;
    dVar26 = 0.0;
    uStack_190 = uStack_390;
    uStack_1a0 = uStack_390;
    do {
      dVar26 = dVar26 + local_818[lVar20];
      lVar20 = lVar20 + 1;
    } while (lVar20 != 9);
    local_1b8 = local_398 * local_198;
    local_898 = dVar52 * dVar52;
    uStack_890 = 0;
    local_928._0_8_ = 1.0 / dVar25;
    uStack_1b0 = uStack_390;
    if (1000.0 <= local_398) {
      local_820 = local_1b8 * 3.195808935e-16 +
                  local_198 * -1.000830325e-11 +
                  local_1a8 * 1.455043351666667e-07 +
                  local_398 * -0.001528146445 +
                  dVar24 * -2.67214561 + dVar52 * -29899.209 + -4.190671200000001;
      local_a30 = local_1b8 * -0.0 +
                  local_198 * -0.0 +
                  local_1a8 * -0.0 +
                  local_398 * -0.0 + dVar24 * -2.5 + dVar52 * 25471.627 + 2.960117638;
      local_9d0 = local_1b8 * 2.18402575e-17 +
                  local_198 * -3.792556183333333e-13 +
                  local_1a8 * 5.171338916666667e-10 +
                  local_398 * 1.377530955e-05 +
                  dVar24 * -2.54205966 + dVar52 * 29230.8027 + -2.37824845;
      local_888 = dVar52 * -835.033997 +
                  local_1b8 * 3.16550358e-16 +
                  local_198 * -2.30789455e-12 +
                  local_1a8 * -1.8779429e-08 + local_398 * 0.000350032206 + 2.99142337;
      local_878 = local_1b8 * -1.27832357e-15 +
                  local_198 * 3.00249098e-11 +
                  local_1a8 * -2.9100867e-07 + local_398 * 0.00152814644 + 2.67214561 +
                  dVar52 * -29899.209;
      local_868 = dVar52 * 29230.8027 +
                  local_1b8 * -8.736103e-17 +
                  local_198 * 1.13776685e-12 +
                  local_1a8 * -1.03426778e-09 + local_398 * -1.37753096e-05 + 2.54205966;
      dStack_860 = dVar52 * 3683.62875 +
                   local_1b8 * -2.66391752e-16 +
                   local_198 * 7.63046685e-12 +
                   local_1a8 * -8.63609193e-08 + local_398 * 0.00052825224 + 2.86472886;
      local_858 = dVar52 * 111.856713 +
                  local_1b8 * -2.1581707e-15 +
                  local_198 * 2.85615925e-11 +
                  local_1a8 * -2.11219383e-07 + local_398 * 0.00111991006 + 4.0172109;
      local_870 = dVar52 * 25471.627 +
                  local_1b8 * 0.0 + local_198 * 0.0 + local_1a8 * 0.0 + local_398 * 0.0 + 2.5;
      dVar44 = dVar52 * -1233.93018 +
               local_1b8 * -2.27287062e-16 +
               local_198 * 4.4382037e-12 +
               local_1a8 * -4.19613997e-08 + local_398 * 0.000306759845 + 3.69757819;
      dVar49 = local_1b8 * 5.68217655e-17 +
               local_198 * -1.479401233333333e-12 +
               local_1a8 * 2.098069983333333e-08 +
               local_398 * -0.0003067598445 +
               dVar24 * -3.69757819 + dVar52 * -1233.93018 + 0.5084126000000002;
      local_838 = local_1b8 * 5.39542675e-16 +
                  local_198 * -9.520530833333334e-12 +
                  local_1a8 * 1.056096916666667e-07 +
                  local_398 * -0.001119910065 +
                  dVar24 * -4.0172109 + dVar52 * 111.856713 + 0.2321087500000001;
      dStack_830 = local_1b8 * 6.6597938e-17 +
                   local_198 * -2.54348895e-12 +
                   local_1a8 * 4.318045966666667e-08 +
                   local_398 * -0.00052825224 +
                   dVar24 * -2.86472886 + dVar52 * 3683.62875 + -2.83691187;
      local_718 = local_1b8 * -7.91375895e-17 +
                  local_198 * 7.692981816666667e-13 +
                  local_1a8 * 9.389714483333333e-09 +
                  local_398 * -0.0003500322055 +
                  dVar24 * -2.99142337 + dVar52 * -835.033997 + 4.34653354;
      dStack_710 = local_1b8 * 7.1582678e-16 +
                   local_198 * -1.957419641666667e-11 +
                   local_1a8 * 2.4578147e-07 +
                   local_398 * -0.002168068195 +
                   dVar24 * -4.57316685 + dVar52 * -18006.9609 + 4.072029891;
      local_850 = local_1b8 * -2.86330712e-15 +
                  local_198 * 5.87225893e-11 +
                  local_1a8 * -4.9156294e-07 + local_398 * 0.0021680682 + 4.57316685;
      dStack_848 = local_1b8 * -1.3506702e-15 +
                   local_198 * 2.52426e-11 +
                   local_1a8 * -1.89492033e-07 + local_398 * 0.0007439885 + 2.92664;
      dVar27 = -18006.9609;
      dVar28 = -922.7977;
    }
    else {
      local_820 = local_1b8 * 1.253294235e-13 +
                  local_198 * -5.807151058333333e-10 +
                  local_1a8 * 1.059116055e-06 +
                  local_398 * -0.00173749123 +
                  dVar24 * -3.38684249 + dVar52 * -30208.1133 + 0.7966096399999998;
      local_a30 = local_1b8 * -0.0 +
                  local_198 * -0.0 +
                  local_1a8 * -0.0 +
                  local_398 * -0.0 + dVar24 * -2.5 + dVar52 * 25471.627 + 2.960117608;
      local_9d0 = local_1b8 * -1.94534818e-14 +
                  local_198 * 1.335702658333333e-10 +
                  local_1a8 * -4.035052833333333e-07 +
                  local_398 * 0.000819083245 +
                  dVar24 * -2.94642878 + dVar52 * 29147.6445 + -0.01756619999999964;
      local_888 = dVar52 * -1012.52087 +
                  local_1b8 * 8.26974448e-14 +
                  local_198 * -2.36885858e-11 +
                  local_1a8 * -2.71433843e-07 + local_398 * 0.000412472087 + 3.29812431;
      local_878 = local_1b8 * -5.01317694e-13 +
                  local_198 * 1.74214532e-09 +
                  local_1a8 * -2.11823211e-06 + local_398 * 0.00173749123 + 3.38684249 +
                  dVar52 * -30208.1133;
      local_868 = dVar52 * 29147.6445 +
                  local_1b8 * 7.78139272e-14 +
                  local_198 * -4.00710797e-10 +
                  local_1a8 * 8.07010567e-07 + local_398 * -0.000819083245 + 2.94642878;
      dStack_860 = dVar52 * 3346.30913 +
                   local_1b8 * 4.12474758e-13 +
                   local_198 * -1.44963411e-09 +
                   local_1a8 * 2.1758823e-06 + local_398 * -0.0016127247 + 4.12530561;
      local_858 = dVar52 * 294.80804 +
                  local_1b8 * 1.85845025e-12 +
                  local_198 * -6.06909735e-09 +
                  local_1a8 * 7.05276303e-06 + local_398 * -0.00237456025 + 4.30179801;
      local_870 = dVar52 * 25471.627 +
                  local_1b8 * 0.0 + local_198 * 0.0 + local_1a8 * 0.0 + local_398 * 0.0 + 2.5;
      dVar44 = dVar52 * -1005.24902 +
               local_1b8 * -1.75371078e-13 +
               local_198 * 3.28469308e-10 +
               local_1a8 * -1.91871682e-07 + local_398 * 0.000563743175 + 3.2129364;
      dVar49 = local_1b8 * 4.38427696e-14 +
               local_198 * -1.094897691666667e-10 +
               local_1a8 * 9.593584116666666e-08 +
               local_398 * -0.000563743175 +
               dVar24 * -3.2129364 + dVar52 * -1005.24902 + -2.82180119;
      local_838 = local_1b8 * -4.646125620000001e-13 +
                  local_198 * 2.02303245e-09 +
                  local_1a8 * -3.526381516666666e-06 +
                  local_398 * 0.002374560255 +
                  dVar24 * -4.30179801 + dVar52 * 294.80804 + 0.5851355599999999;
      dStack_830 = local_1b8 * -1.031186895e-13 +
                   local_198 * 4.832113691666666e-10 +
                   local_1a8 * -1.087941151666667e-06 +
                   local_398 * 0.001612724695 +
                   dVar24 * -4.12530561 + dVar52 * 3346.30913 + 4.81573857;
      local_718 = local_1b8 * -2.06743612e-14 +
                  local_198 * 7.896195275e-12 +
                  local_1a8 * 1.357169215e-07 +
                  local_398 * -0.000412472087 +
                  dVar24 * -3.29812431 + dVar52 * -1012.52087 + 6.5922184;
      dStack_710 = local_1b8 * -1.235757375e-13 +
                   local_198 * 3.854837933333333e-10 +
                   local_1a8 * 2.475020966666667e-08 +
                   local_398 * -0.003284612905 +
                   dVar24 * -3.38875365 + dVar52 * -17663.1465 + -3.39660955;
      local_850 = local_1b8 * 4.9430295e-13 +
                  local_198 * -1.15645138e-09 +
                  local_1a8 * -4.95004193e-08 + local_398 * 0.0032846129 + 3.38875365;
      dStack_848 = local_1b8 * -4.88971e-13 +
                   local_198 * 1.41037875e-09 +
                   local_1a8 * -1.321074e-06 + local_398 * 0.00070412 + 3.298677;
      dVar27 = -17663.1465;
      dVar28 = -1020.9;
    }
    local_850 = dVar52 * dVar27 + local_850;
    dStack_848 = dVar52 * dVar28 + dStack_848;
    local_8c8._8_4_ = SUB84(local_870,0);
    local_8c8._0_8_ = local_858;
    local_8c8._12_4_ = (int)((ulong)local_870 >> 0x20);
    dVar27 = local_818[0] + dVar26;
    dVar36 = local_818[1] * -0.21999999999999997;
    dVar28 = local_818[2] * 10.0;
    dVar40 = local_818[1] * local_818[3];
    local_900 = dVar52 * -0.0;
    local_880 = dVar44;
    dVar29 = exp(dVar24 * 0.6 + local_900);
    dVar29 = dVar29 * 1475000.0;
    local_8a8 = local_898 * 0.0;
    uStack_8a0 = uStack_890;
    local_728 = dVar52 * 0.6 + local_8a8;
    dVar30 = exp(dVar24 * -1.72 + dVar52 * -264.08810621431707);
    dVar27 = dVar30 * 6.366e+20 * (((dVar28 + dVar36 + dVar27) * 1e-12) / dVar29);
    local_948 = dVar27 / (dVar27 + 1.0);
    dVar45 = ((dVar52 * -1.72 + local_898 * 264.08810621431707) - local_728) * 0.43429448190325176;
    local_798 = dVar45 / (dVar27 + 1.0);
    dVar27 = log10(dVar27);
    local_8d8 = local_398 / -1e-30;
    dStack_8d0 = (double)uStack_390;
    dVar28 = exp(local_8d8);
    local_918 = local_398 / -1e+30;
    uStack_910 = (double)uStack_390;
    local_7a8 = exp(local_918);
    local_7a8 = local_7a8 * 0.8;
    local_8b8 = dVar28 * 0.19999999999999996 + local_7a8 + 0.0;
    dVar30 = log10(local_8b8);
    local_8e8._0_8_ = dVar30 * -1.27 + 0.75;
    dVar27 = dVar30 * -0.67 + -0.4 + dVar27;
    local_7b8 = 1.0 / (dVar27 * -0.14 + (double)local_8e8._0_8_);
    local_938 = dVar27 * local_7b8;
    local_8f8 = 1.0 / (local_938 * local_938 + 1.0);
    dVar36 = pow(10.0,dVar30 * local_8f8);
    dVar27 = local_818[6];
    dVar30 = (dVar30 + dVar30) * local_8f8 * local_8f8 * local_938 * local_7b8;
    dVar46 = -(double)local_8e8._0_8_ * dVar30 * local_7b8;
    dVar30 = (dVar30 * local_938 * -1.27 + dVar46 * -0.67 + local_8f8) *
             (local_7a8 / -1e+30 + (dVar28 * 0.19999999999999996) / -1e-30) *
             (0.43429448190325176 / local_8b8) + dVar45 * dVar46 + local_798;
    local_7a8 = dVar49 + local_a30;
    dStack_7a0 = dVar49;
    local_798 = dVar49;
    dStack_790 = dVar49;
    dVar49 = exp(local_7a8 - local_838);
    dVar28 = local_818[7];
    dVar49 = dVar29 / (dVar49 * (double)local_928._0_8_);
    dVar36 = dVar36 * local_948;
    dVar45 = (dVar29 * dVar40 - dVar27 * dVar49) * dVar36;
    local_998._8_8_ = (double)local_998._8_8_ - dVar45;
    dStack_980 = dStack_980 - dVar45;
    local_968 = dVar45 + local_968;
    lVar20 = 0;
    local_778[0] = 0.0;
    local_778[1] = local_818[3] * dVar29 * dVar36 + 0.0;
    local_778[2] = 0.0;
    local_778[3] = dVar29 * dVar36 * local_818[1] + 0.0;
    local_778[4] = 0.0;
    local_778[5] = 0.0;
    local_778[6] = 0.0 - dVar49 * dVar36;
    local_778[7] = 0.0;
    local_778[8] = 0.0;
    pdVar21 = local_708 + 1;
    do {
      dVar46 = local_778[lVar20];
      *pdVar21 = *pdVar21 - dVar46;
      pdVar21[2] = pdVar21[2] - dVar46;
      pdVar21[5] = dVar46 + pdVar21[5];
      lVar20 = lVar20 + 1;
      pdVar21 = pdVar21 + 10;
    } while (lVar20 != 9);
    dVar27 = dVar36 * (local_728 * dVar29 * dVar40 +
                      -(local_728 -
                       (((double)local_8c8._0_8_ - ((double)local_8c8._8_8_ + dVar44)) + 1.0) *
                       dVar52) * dVar49 * dVar27) + dVar30 * 2.302585092994046 * dVar45;
    pdVar21 = local_708 + 7;
    local_438[1] = local_438[1] - dVar27;
    local_438[3] = local_438[3] - dVar27;
    local_438[6] = dVar27 + local_438[6];
    dVar27 = local_818[0] * 1.5;
    dVar49 = local_818[2] * 11.0;
    dVar36 = exp(dVar52 * -24370.78312492259 + dVar24 * 0.0);
    dVar36 = dVar36 * 295100000000000.0;
    local_8c8._0_8_ = local_898 * 24370.78312492259 + dVar52 * 0.0;
    dVar44 = exp(dVar52 * -22896.35829411476 + dVar24 * 0.0);
    dVar27 = dVar44 * 1.202e+17 * (((dVar49 + dVar27 + dVar26) * 1e-06) / dVar36);
    local_948 = dVar27 / (dVar27 + 1.0);
    local_728 = ((local_898 * 22896.35829411476 + dVar52 * 0.0) - (double)local_8c8._0_8_) *
                0.43429448190325176;
    dVar41 = local_728 / (dVar27 + 1.0);
    dVar27 = log10(dVar27);
    dVar40 = exp(local_8d8);
    local_8d8 = exp(local_918);
    local_8d8 = local_8d8 * 0.5;
    dVar37 = dVar40 * 0.5 + local_8d8 + 0.0;
    local_7b8 = log10(dVar37);
    dVar49 = local_7b8 * -1.27 + 0.75;
    dVar27 = local_7b8 * -0.67 + -0.4 + dVar27;
    dVar46 = 1.0 / (dVar27 * -0.14 + dVar49);
    local_8e8._0_8_ = dVar27 * dVar46;
    local_8b8 = 1.0 / ((double)local_8e8._0_8_ * (double)local_8e8._0_8_ + 1.0);
    local_918 = pow(10.0,local_7b8 * local_8b8);
    dVar30 = local_818[5];
    dVar44 = dStack_830;
    dVar45 = local_8d8 / -1e+30;
    dVar42 = (local_7b8 + local_7b8) * local_8b8 * local_8b8 * (double)local_8e8._0_8_ * dVar46;
    dVar46 = -dVar49 * dVar42 * dVar46;
    dVar42 = dVar42 * (double)local_8e8._0_8_;
    dVar47 = dVar46 * -0.67 + local_8b8;
    dVar46 = dVar46 * local_728;
    local_728 = dStack_710;
    dStack_720 = dStack_710;
    dVar43 = local_818[5] * local_818[5];
    dVar27 = exp(dStack_710 - (dStack_830 + dStack_830));
    dVar29 = local_818[2];
    dVar49 = local_818[0];
    local_8d8 = dStack_860;
    dVar38 = dVar36 / (dVar27 * dVar25);
    dVar27 = local_918 * local_948;
    dVar48 = (dVar36 * dVar28 - dVar43 * dVar38) * dVar27;
    local_948 = dVar48 + dVar48 + dStack_970;
    dStack_970 = local_948;
    dStack_960 = dStack_960 - dVar48;
    local_778[0] = 0.0;
    local_778[1] = 0.0;
    local_778[2] = 0.0;
    local_778[3] = 0.0;
    lVar20 = 0;
    local_778[4] = 0.0;
    local_778[5] = dVar38 * dVar27 * -2.0 * dVar30 + 0.0;
    local_778[6] = 0.0;
    local_778[7] = dVar36 * dVar27 + 0.0;
    local_778[8] = 0.0;
    do {
      dVar1 = local_778[lVar20];
      pdVar21[-2] = dVar1 + dVar1 + pdVar21[-2];
      *pdVar21 = *pdVar21 - dVar1;
      lVar20 = lVar20 + 1;
      pdVar21 = pdVar21 + 10;
    } while (lVar20 != 9);
    dVar27 = dVar27 * ((double)local_8c8._0_8_ * dVar36 * dVar28 +
                      -((double)local_8c8._0_8_ -
                       (((dStack_860 + dStack_860) - local_850) + -1.0) * dVar52) * dVar38 * dVar43)
             + (dVar46 + (dVar42 * -1.27 + dVar47) *
                         (dVar45 + (dVar40 * 0.5) / -1e-30) * (0.43429448190325176 / dVar37) +
               dVar41) * 2.302585092994046 * dVar48;
    local_438[5] = dVar27 + dVar27 + local_438[5];
    local_438[7] = local_438[7] - dVar27;
    dVar45 = local_818[2] * 11.0 + local_818[0] * 1.5 + dVar26;
    dVar28 = exp(dVar24 * -1.4 + dVar52 * -52525.755576696676);
    dVar26 = local_818[3];
    dVar28 = dVar28 * 45770000000000.0;
    dVar40 = dVar52 * -1.4 + local_898 * 52525.755576696676;
    local_8c8._8_8_ = 0;
    local_8c8._0_8_ = local_818[3] * local_818[3];
    dVar36 = exp(local_718 - (local_a30 + local_a30));
    dVar27 = local_818[4];
    dVar36 = dVar28 / (dVar25 * dVar36);
    local_918 = local_870;
    local_778[1] = dVar28 * dVar49 - (double)local_8c8._0_8_ * dVar36;
    dVar25 = dVar45 * local_778[1];
    local_998._0_8_ = (double)local_998._0_8_ - dVar25;
    dVar25 = dVar25 + dVar25 + dStack_980;
    dStack_980 = dVar25;
    local_778[0] = local_778[1] * 2.5 + dVar28 * dVar45;
    local_778[2] = local_778[1] * 12.0;
    local_778[3] = dVar36 * dVar45 * -2.0 * dVar26 + local_778[1];
    local_778[4] = local_778[1];
    local_778[7] = local_778[1];
    local_778[8] = local_778[1];
    local_778[5] = local_778[1];
    local_778[6] = local_778[1];
    lVar20 = 0;
    do {
      dVar46 = local_778[lVar20];
      *pdVar19 = *pdVar19 - dVar46;
      pdVar19[3] = dVar46 + dVar46 + pdVar19[3];
      lVar20 = lVar20 + 1;
      pdVar19 = pdVar19 + 10;
    } while (lVar20 != 9);
    dVar28 = (dVar40 * dVar28 * dVar49 -
             (dVar40 - (((local_870 + local_870) - local_888) + -1.0) * dVar52) * dVar36 *
             (double)local_8c8._0_8_) * dVar45;
    pdVar19 = local_708 + 1;
    local_438[0] = local_438[0] - dVar28;
    local_438[3] = dVar28 + dVar28 + local_438[3];
    local_8c8._8_8_ = 0;
    local_8c8._0_8_ = local_818[4] * local_818[4];
    local_938 = exp(dVar24 * -0.5 + local_900);
    dVar36 = local_818[1];
    local_938 = local_938 * 6165.0;
    local_8b8 = dVar52 * -0.5 + local_8a8;
    local_7b8 = -local_798;
    dStack_7b0 = -dStack_790;
    dVar28 = exp((local_9d0 + local_9d0) - local_798);
    dVar49 = local_868;
    dVar40 = local_938 / (dVar28 * (double)local_928._0_8_);
    local_8e8._0_8_ = local_880;
    dVar37 = local_8b8 - ((local_880 - (local_868 + local_868)) + 1.0) * dVar52;
    local_778[3] = local_938 * (double)local_8c8._0_8_ - dVar36 * dVar40;
    dVar46 = dVar45 * local_778[3];
    dVar28 = local_8b8 * local_938 * (double)local_8c8._0_8_;
    local_8b8 = (double)local_998._8_8_ + dVar46;
    local_998._8_8_ = local_8b8;
    local_8c8._8_8_ = 0;
    local_8c8._0_8_ = local_978 - (dVar46 + dVar46);
    local_778[0] = local_778[3] * 2.5;
    local_778[1] = local_778[3] - dVar40 * dVar45;
    local_778[2] = local_778[3] * 12.0;
    local_778[4] = (local_938 * dVar45 + local_938 * dVar45) * dVar27 + local_778[3];
    local_778[7] = local_778[3];
    local_778[8] = local_778[3];
    local_778[5] = local_778[3];
    local_778[6] = local_778[3];
    lVar20 = 0;
    do {
      dVar46 = local_778[lVar20];
      *pdVar19 = *pdVar19 + dVar46;
      pdVar19[3] = pdVar19[3] - (dVar46 + dVar46);
      lVar20 = lVar20 + 1;
      pdVar19 = pdVar19 + 10;
    } while (lVar20 != 9);
    dVar28 = (dVar28 - dVar37 * dVar40 * dVar36) * dVar45;
    pdVar19 = local_708 + 5;
    local_438[1] = local_438[1] + dVar28;
    local_438[4] = local_438[4] - (dVar28 + dVar28);
    local_938 = dVar27 * dVar26;
    dStack_930 = 0.0;
    local_8f8 = exp(local_900 - dVar24);
    local_8f8 = local_8f8 * 4714000.0;
    local_7c8 = local_8a8 - dVar52;
    dStack_7c0 = (double)uStack_8a0;
    dVar28 = exp((local_a30 + local_9d0) - dVar44);
    dVar28 = local_8f8 / (dVar28 * (double)local_928._0_8_);
    local_778[1] = local_8f8 * local_938 - dVar30 * dVar28;
    dVar40 = dVar45 * local_778[1];
    dVar25 = dVar25 - dVar40;
    uVar50 = SUB84((double)local_8c8._0_8_ - dVar40,0);
    uVar51 = (undefined4)((ulong)((double)local_8c8._0_8_ - dVar40) >> 0x20);
    local_948 = dVar40 + local_948;
    local_778[0] = local_778[1] * 2.5;
    local_778[2] = local_778[1] * 12.0;
    local_778[3] = local_778[1] + dVar27 * local_8f8 * dVar45;
    local_778[4] = local_778[1] + dVar26 * local_8f8 * dVar45;
    local_778[5] = local_778[1] - dVar28 * dVar45;
    local_778[6] = local_778[1];
    local_778[7] = local_778[1];
    local_778[8] = local_778[1];
    auVar33._8_4_ = uVar50;
    auVar33._0_8_ = dVar25;
    auVar33._12_4_ = uVar51;
    auVar8._8_4_ = uVar50;
    auVar8._0_8_ = dVar25;
    auVar8._12_4_ = uVar51;
    dStack_980 = dVar25;
    local_978 = auVar8._8_8_;
    uStack_940 = 0;
    dStack_970 = local_948;
    lVar20 = 0;
    do {
      dVar40 = local_778[lVar20];
      pdVar19[-2] = pdVar19[-2] - dVar40;
      pdVar19[-1] = pdVar19[-1] - dVar40;
      *pdVar19 = dVar40 + *pdVar19;
      lVar20 = lVar20 + 1;
      pdVar19 = pdVar19 + 10;
    } while (lVar20 != 9);
    dVar28 = (local_7c8 * local_8f8 * local_938 -
             (local_7c8 - ((local_8d8 - (local_918 + dVar49)) + 1.0) * dVar52) * dVar28 * dVar30) *
             dVar45;
    pdVar19 = local_708 + 2;
    local_438[3] = local_438[3] - dVar28;
    local_438[4] = local_438[4] - dVar28;
    local_438[5] = dVar28 + local_438[5];
    local_938 = dVar26 * dVar30;
    dStack_930 = 0.0;
    local_188 = dVar24 + dVar24;
    local_7c8 = exp(local_900 - local_188);
    local_7c8 = local_7c8 * 38000000000.0;
    local_8c8._8_8_ = 0;
    local_8c8._0_8_ = dVar52 + dVar52;
    local_8f8 = local_8a8 - (dVar52 + dVar52);
    dStack_8f0 = (double)uStack_8a0;
    local_1c0 = local_a30 - local_820;
    dVar28 = exp(dVar44 + local_1c0);
    dVar28 = local_7c8 / ((double)local_928._0_8_ * dVar28);
    local_778[1] = local_7c8 * local_938 - dVar29 * dVar28;
    dVar40 = dVar45 * local_778[1];
    local_988 = local_988 + dVar40;
    dStack_a10 = auVar33._8_8_;
    local_928._0_8_ = dVar25 - dVar40;
    local_928._8_8_ = dStack_a10;
    local_948 = local_948 - dVar40;
    local_778[0] = local_778[1] * 2.5;
    local_778[2] = -dVar28 * dVar45 + local_778[1] * 12.0;
    local_778[3] = local_778[1] + dVar30 * local_7c8 * dVar45;
    local_778[4] = local_778[1];
    local_778[5] = local_7c8 * dVar45 * dVar26 + local_778[1];
    local_778[6] = local_778[1];
    local_778[7] = local_778[1];
    local_778[8] = local_778[1];
    lVar20 = 0;
    do {
      dVar25 = local_778[lVar20];
      *pdVar19 = *pdVar19 + dVar25;
      pdVar19[1] = pdVar19[1] - dVar25;
      pdVar19[3] = pdVar19[3] - dVar25;
      lVar20 = lVar20 + 1;
      pdVar19 = pdVar19 + 10;
    } while (lVar20 != 9);
    dVar45 = dVar45 * (local_8f8 * local_7c8 * local_938 -
                      (local_8f8 - ((local_878 - (local_918 + local_8d8)) + 1.0) * dVar52) * dVar28
                      * dVar29);
    local_438[2] = local_438[2] + dVar45;
    local_438[3] = local_438[3] - dVar45;
    local_438[5] = local_438[5] - dVar45;
    local_8f8 = exp(dVar24 * -0.406 + dVar52 * -8352.893435692547);
    local_8f8 = local_8f8 * 3547000000.0;
    local_938 = dVar52 * -0.406 + local_898 * 8352.893435692547;
    dStack_930 = 0.0;
    dVar29 = exp((local_7a8 - local_9d0) - dVar44);
    dVar28 = local_818[0];
    dVar29 = local_8f8 / dVar29;
    dVar40 = local_8f8 * dVar26 * dVar36 - dVar27 * dVar30 * dVar29;
    dVar49 = local_938 * local_8f8 * dVar26 * dVar36 -
             (local_938 - ((dVar49 + local_8d8) - ((double)local_8e8._0_8_ + local_918)) * dVar52) *
             dVar29 * dVar27 * dVar30;
    dStack_980 = (double)local_928._0_8_ - dVar40;
    dVar26 = dVar26 * local_8f8;
    local_6c0[2] = local_6c0[2] - dVar26;
    local_6c0[4] = local_6c0[4] - dVar26;
    dVar25 = dVar26 + (double)local_698._8_8_;
    local_698._8_4_ = SUB84(dVar25,0);
    local_698._0_8_ = dVar26 + (double)local_698._0_8_;
    local_698._12_4_ = (int)((ulong)dVar25 >> 0x20);
    dVar36 = local_8f8 * dVar36;
    dStack_610 = dStack_610 - dVar36;
    dStack_600 = dStack_600 - dVar36;
    local_5f8 = dVar36 + local_5f8;
    dStack_5f0 = dVar36 + dStack_5f0;
    dVar30 = dVar30 * -dVar29;
    local_5c0 = local_5c0 - dVar30;
    local_5b0 = local_5b0 - dVar30;
    local_5a8 = dVar30 + local_5a8;
    dStack_5a0 = dVar30 + dStack_5a0;
    local_978 = dStack_a10 + dVar40;
    dVar25 = -dVar29 * dVar27;
    local_570 = local_570 - dVar25;
    local_560 = local_560 - dVar25;
    dStack_558 = dVar25 + dStack_558;
    dStack_550 = dVar25 + dStack_550;
    auVar9._8_4_ = SUB84(local_948 + dVar40,0);
    auVar9._0_8_ = local_978;
    auVar9._12_4_ = (int)((ulong)(local_948 + dVar40) >> 0x20);
    dStack_970 = auVar9._8_8_;
    local_438[3] = local_438[3] - dVar49;
    local_438[4] = dVar49 + local_438[4];
    local_438[5] = dVar49 + local_438[5];
    dVar27 = dVar27 * local_818[0];
    local_998._8_8_ = local_8b8 - dVar40;
    local_438[1] = local_438[1] - dVar49;
    local_8d8 = exp(dVar24 * 2.67 + dVar52 * -3165.232827911689);
    dVar26 = local_818[3];
    local_8d8 = local_8d8 * 0.0508;
    dVar25 = dVar52 * 2.67 + local_898 * 3165.232827911689;
    local_928._8_8_ = 0;
    local_928._0_8_ = local_818[5];
    dVar29 = local_818[3] * local_818[5];
    dVar49 = exp(((local_718 - local_a30) + local_9d0) - dVar44);
    dVar49 = local_8d8 / dVar49;
    dVar30 = local_8d8 * dVar27 - dVar29 * dVar49;
    local_998._0_8_ = (double)local_998._0_8_ - dVar30;
    dStack_980 = dStack_980 + dVar30;
    local_978 = local_978 - dVar30;
    dStack_970 = dVar30 + dStack_970;
    dVar30 = local_818[4] * local_8d8;
    local_708[0] = local_708[0] - dVar30;
    local_708[3] = local_708[3] + dVar30;
    local_708[4] = local_708[4] - dVar30;
    local_708[5] = dVar30 + local_708[5];
    dVar25 = dVar25 * local_8d8 * dVar27 -
             (dVar25 - ((local_870 + dStack_860) - (local_888 + local_868)) * dVar52) * dVar49 *
             dVar29;
    dVar27 = (double)local_928._0_8_ * -dVar49;
    local_618 = local_618 - dVar27;
    dStack_600 = dStack_600 + dVar27;
    local_5f8 = local_5f8 - dVar27;
    dStack_5f0 = dVar27 + dStack_5f0;
    dVar27 = local_8d8 * dVar28;
    local_5c8 = local_5c8 - dVar27;
    local_5b0 = local_5b0 + dVar27;
    local_5a8 = local_5a8 - dVar27;
    dStack_5a0 = dVar27 + dStack_5a0;
    dVar26 = -dVar49 * dVar26;
    local_578 = local_578 - dVar26;
    local_560 = local_560 + dVar26;
    dStack_558 = dStack_558 - dVar26;
    dStack_550 = dVar26 + dStack_550;
    local_438[0] = local_438[0] - dVar25;
    local_438[3] = local_438[3] + dVar25;
    local_438[4] = local_438[4] - dVar25;
    local_438[5] = dVar25 + local_438[5];
    dVar40 = exp(dVar24 * 1.51 + dVar52 * -1726.0331637101897);
    dVar30 = local_898;
    local_8d8 = local_898 * 1726.0331637101897;
    dStack_8d0 = local_898 * 6743.103321783248;
    local_338 = local_818[2];
    uStack_330 = 0;
    local_328 = local_818[3];
    uStack_320 = 0;
    local_8e8._0_8_ = exp(((local_718 - local_820) - local_a30) + dVar44);
    dVar36 = local_438[2];
    dVar29 = dStack_550;
    dVar49 = local_578;
    dVar25 = local_818[4];
    local_8e8._8_8_ = extraout_XMM0_Qb;
    dVar45 = local_888 + dStack_860;
    dVar38 = local_878 + local_870;
    local_348 = (double)local_998._0_8_;
    local_358 = local_818[5];
    uStack_350 = 0;
    local_788 = local_708[0];
    local_318 = local_708[5];
    local_308 = local_668;
    local_780 = dStack_658;
    local_2f8 = local_650;
    local_3b8 = local_640;
    local_3a8 = local_618;
    local_7c8 = dStack_5f0;
    local_948 = dStack_568;
    local_8b8 = local_560;
    local_7a8 = local_438[0];
    local_918 = local_438[5];
    local_8f8 = local_818[0];
    local_938 = exp(dVar24 * 2.02 + dVar52 * -6743.103321783248);
    local_2e8 = dVar44 * -2.0;
    dVar26 = exp(local_820 + local_9d0 + local_2e8);
    dVar40 = dVar40 * 216.0;
    dStack_1d0 = local_938 * 2.97;
    auVar31._8_8_ = dStack_1d0;
    auVar31._0_8_ = dVar40;
    auVar6._8_8_ = dVar26;
    auVar6._0_8_ = local_8e8._0_8_;
    local_8e8 = divpd(auVar31,auVar6);
    dVar46 = local_8e8._0_8_;
    local_938 = local_328 * local_338;
    dStack_930 = local_358 * local_358;
    dVar28 = dVar28 * (double)local_928._0_8_;
    dVar27 = dVar25 * local_338;
    auVar14._8_4_ = SUB84(dVar27,0);
    auVar14._0_8_ = dVar28;
    auVar14._12_4_ = (int)((ulong)dVar27 >> 0x20);
    local_1d8 = dVar40 * dVar28 - local_938 * dVar46;
    local_998._0_8_ = local_348 - local_1d8;
    local_988 = local_1d8 + local_988;
    dStack_980 = local_1d8 + dStack_980;
    dVar26 = local_358 * dVar40;
    local_708[0] = local_788 - dVar26;
    local_708[5] = local_318 - dVar26;
    local_708[2] = dVar26 + local_708[2];
    local_708[3] = dVar26 + local_708[3];
    dVar37 = local_328 * -dVar46;
    local_668 = local_308 - dVar37;
    local_650 = local_2f8 + dVar37;
    dVar41 = -dVar46 * local_338;
    local_618 = local_3a8 - dVar41;
    dStack_5f0 = local_7c8 - dVar41;
    auVar12._8_4_ = SUB84(dStack_1d0,0);
    auVar12._0_8_ = dVar40;
    auVar12._12_4_ = (int)((ulong)dStack_1d0 >> 0x20);
    dVar26 = local_818[2] * dStack_1d0;
    local_5b8 = local_5b8 - dVar26;
    local_5a8 = local_5a8 - dVar26;
    dStack_5a0 = dVar26 + dVar26 + dStack_5a0;
    local_608 = dVar41 + local_608;
    dStack_600 = dVar41 + dStack_600;
    local_8f8 = local_8f8 * dVar40;
    local_578 = dVar49 - local_8f8;
    local_560 = local_8b8 + local_8f8;
    dVar26 = dVar52 * 1.51 + local_8d8;
    dVar49 = dVar52 * 2.02 + dStack_8d0;
    dVar26 = dVar26 * dVar40 * dVar28 - (dVar26 - (dVar38 - dVar45) * dVar52) * dVar46 * local_938;
    dVar27 = dVar49 * dStack_1d0 * dVar27 -
             (dVar49 - ((dStack_860 + dStack_860) - (local_878 + local_868)) * dVar52) *
             local_8e8._8_8_ * dStack_930;
    local_438[0] = local_7a8 - dVar26;
    dVar25 = dStack_1d0 * dVar25;
    dStack_658 = (local_780 + dVar37) - dVar25;
    local_648 = local_648 - dVar25;
    local_640 = dVar25 + dVar25 + (local_3b8 - dVar37);
    dVar25 = local_8e8._8_8_ * -2.0 * local_818[5];
    dStack_568 = (local_948 + local_8f8) - dVar25;
    dStack_558 = dStack_558 - dVar25;
    dStack_550 = dVar25 + dVar25 + (dVar29 - local_8f8);
    local_438[2] = (dVar36 + dVar26) - dVar27;
    local_438[3] = local_438[3] + dVar26;
    local_438[4] = local_438[4] - dVar27;
    local_438[5] = dVar27 + dVar27 + (local_918 - dVar26);
    local_8f8 = local_818[3];
    dStack_8f0 = 0.0;
    local_7c8 = local_818[6];
    dStack_7c0 = 0.0;
    dVar24 = dVar24 * 0.0;
    local_8b8 = dVar52;
    dStack_8b0 = dVar52;
    local_3b8 = exp(dVar52 * -414.1473159572846 + dVar24);
    dVar36 = local_818[0];
    local_3b8 = local_3b8 * 16600000.0;
    dVar27 = dVar52 * 0.0;
    dVar26 = local_898 * 414.1473159572846 + dVar27;
    local_948 = local_818[1];
    uStack_940 = 0;
    local_3a8 = local_818[0] * local_818[1];
    uStack_3a0 = 0;
    dVar25 = exp((-local_718 - local_798) + local_a30 + local_838);
    dVar25 = local_3b8 / dVar25;
    dVar28 = dVar26 * local_3b8;
    local_368 = (dVar26 - ((local_888 + local_880) - (local_870 + local_858)) * dVar52) * dVar25 *
                local_3a8;
    local_7a8 = local_968;
    dStack_7a0 = 0.0;
    local_318 = local_708[3];
    local_308 = local_708[6];
    local_2f8 = local_6c0[4];
    local_3d0 = local_3b8 * local_7c8;
    local_618 = local_3d0 + local_618;
    dStack_610 = local_3d0 + dStack_610;
    local_780 = dStack_600 - local_3d0;
    local_3d0 = local_5e8 - local_3d0;
    local_218 = local_3b8 * local_8f8;
    local_528 = local_218 + local_528;
    dStack_520 = local_218 + dStack_520;
    local_208 = (double)local_510._0_8_ - local_218;
    uStack_200 = 0;
    local_218 = dStack_4f8 - local_218;
    local_328 = local_438[3];
    uStack_320 = 0;
    local_788 = local_438[6];
    local_8e8._0_8_ = local_8e8._8_8_;
    local_948 = local_948 * -dVar25;
    local_348 = local_948 + local_708[0];
    dStack_340 = local_948 + local_708[1];
    dVar36 = dVar36 * -dVar25;
    local_1e8 = dVar36 + local_6c0[1];
    dStack_1e0 = dVar36 + local_6c0[2];
    local_8e8._8_8_ = dVar25;
    local_918 = exp(dVar52 * -148.4489164123924 + dVar24);
    dVar26 = local_818[5];
    local_8d8 = local_898 * 148.4489164123924;
    dStack_8d0 = 0.0;
    local_228 = exp(local_2e8 + local_a30 + local_838);
    local_238 = dStack_860;
    uStack_230 = 0;
    local_378 = local_858;
    local_2e8 = (dStack_860 + dStack_860) - (local_870 + local_858);
    uStack_2e0 = 0;
    local_928._8_8_ = 0;
    local_928._0_8_ = local_818[6];
    local_3e0 = dStack_5f0;
    local_358 = dStack_550;
    local_338 = dStack_548;
    local_3d8 = local_500;
    local_3c8 = local_438[5];
    local_900 = local_900 + dVar24;
    local_388 = exp(local_900);
    local_1f8 = dVar26;
    dStack_1f0 = local_818[1];
    dVar29 = exp(((local_9d0 - local_798) - dVar44) + local_838);
    dVar40 = local_2e8;
    local_918 = local_918 * 70790000.0;
    uStack_910 = local_388 * 32500000.0;
    dVar25 = local_918 * (double)local_928._0_8_;
    dStack_600 = local_780 - dVar25;
    local_780 = (double)local_698._0_8_;
    local_2e8 = (double)local_698._8_8_;
    local_5e8 = local_3d0 - dVar25;
    dStack_5f0 = dVar25 + dVar25 + local_3e0;
    dVar25 = uStack_910 * (double)local_928._0_8_;
    local_5c0 = local_5c0 + dVar25;
    local_5a8 = local_5a8 - dVar25;
    local_598 = local_598 - dVar25;
    dStack_5a0 = dVar25 + dStack_5a0;
    dVar49 = local_918 * local_818[3];
    dStack_4f8 = uStack_910 * local_818[4];
    dStack_520 = dStack_520 + dStack_4f8;
    dVar25 = (double)local_510._8_8_ - dStack_4f8;
    local_510._8_4_ = SUB84(dVar25,0);
    local_510._0_8_ = local_208 - dVar49;
    local_510._12_4_ = (int)((ulong)dVar25 >> 0x20);
    local_500 = dVar49 + dVar49 + local_3d8 + dStack_4f8;
    dStack_4f8 = (local_218 - dVar49) - dStack_4f8;
    local_798 = local_7c8 * local_8f8;
    dStack_790 = local_818[4] * (double)local_928._0_8_;
    local_368 = dVar28 * local_798 - local_368;
    dStack_a20 = auVar12._8_8_;
    dStack_a40 = auVar14._8_8_;
    dVar28 = dStack_a40 * dStack_a20 - dStack_930 * (double)local_8e8._0_8_;
    dVar49 = local_798 * local_3b8 - local_3a8 * (double)local_8e8._8_8_;
    auVar32._8_8_ = uStack_910;
    auVar32._0_8_ = local_918;
    auVar7._8_8_ = dVar29;
    auVar7._0_8_ = local_228;
    auVar33 = divpd(auVar32,auVar7);
    local_8d8 = local_8d8 + dVar27;
    dStack_8d0 = local_8a8 + dVar27;
    dVar45 = auVar33._0_8_;
    dVar25 = dVar26 * local_1f8;
    dVar26 = dVar26 * dStack_1f0;
    auVar10._8_4_ = SUB84(dVar26,0);
    auVar10._0_8_ = dVar25;
    auVar10._12_4_ = (int)((ulong)dVar26 >> 0x20);
    dVar46 = auVar33._8_8_;
    local_7c8 = -dVar46;
    dStack_7c0 = -dVar46;
    dVar29 = dVar45 * -2.0 * local_1f8;
    dStack_548 = local_7c8 * dStack_1f0;
    local_978 = local_978 - dVar28;
    auVar11._8_4_ = SUB84(dStack_970 - local_1d8,0);
    auVar11._0_8_ = local_978;
    auVar11._12_4_ = (int)((ulong)(dStack_970 - local_1d8) >> 0x20);
    dStack_970 = auVar11._8_8_;
    local_708[0] = local_348;
    local_708[1] = dStack_340;
    local_708[3] = local_318 - local_948;
    local_708[6] = local_308 - local_948;
    local_6c0[1] = local_1e8;
    local_6c0[2] = dStack_1e0;
    local_6c0[4] = local_2f8 - dVar36;
    dVar36 = local_688 - dVar36;
    dStack_970 = dVar28 + dVar28 + dStack_970;
    local_988 = local_988 - dVar28;
    dStack_980 = dStack_980 - dVar49;
    local_968 = local_7a8 - dVar49;
    dVar28 = dVar49 + (double)local_998._8_8_;
    local_998._8_4_ = SUB84(dVar28,0);
    local_998._0_8_ = dVar49 + (double)local_998._0_8_;
    local_998._12_4_ = (int)((ulong)dVar28 >> 0x20);
    local_438[0] = local_368 + local_438[0];
    local_2f8 = dStack_1e0;
    uStack_2f0 = 0;
    auVar13._8_4_ = SUB84(local_368 + local_438[1],0);
    auVar13._0_8_ = local_438[0];
    auVar13._12_4_ = (int)((ulong)(local_368 + local_438[1]) >> 0x20);
    local_348 = local_918 * local_798 - dVar25 * dVar45;
    local_8f8 = local_348 + local_348 + dStack_970;
    dVar25 = local_8d8 * local_918 * local_798 - (local_8d8 - dVar40 * local_8b8) * dVar45 * dVar25;
    local_438[6] = dStack_8d0 * uStack_910 * dStack_790 -
                   (dStack_8d0 - ((local_238 + local_880) - (local_378 + local_868)) * dStack_8b0) *
                   dVar46 * dVar26;
    local_570 = local_570 + dStack_548;
    local_560 = local_560 - dVar29;
    dStack_558 = dStack_558 - dStack_548;
    dStack_550 = dVar29 + dVar29 + local_358 + dStack_548;
    dStack_548 = (local_338 - dVar29) - dStack_548;
    local_438[3] = (local_328 - local_368) - dVar25;
    local_438[4] = local_438[4] - local_438[6];
    local_438[1] = auVar13._8_8_;
    local_438[1] = local_438[1] + local_438[6];
    local_438[5] = dVar25 + dVar25 + local_3c8 + local_438[6];
    local_438[6] = ((local_788 - local_368) - dVar25) - local_438[6];
    local_358 = (double)local_998._8_8_;
    local_7a8 = local_968 - local_348;
    dStack_8f0 = uStack_910;
    local_688 = dVar36;
    local_368 = dVar27;
    dStack_360 = dVar27;
    dStack_340 = uStack_910;
    local_378 = exp(dVar52 * 250.09868290494586 + dVar24);
    local_218 = local_818[1];
    uStack_210 = 0;
    local_388 = exp((local_7b8 - local_820) + dVar44 + local_838);
    local_8a8 = (local_880 + local_878) - (dStack_860 + local_858);
    uStack_8a0 = 0;
    local_1d8 = dStack_520;
    dStack_1d0 = 0.0;
    local_3a8 = local_518;
    uStack_3a0 = local_510._0_8_;
    local_228 = local_500;
    local_3b8 = dStack_4f8;
    local_328 = local_438[1];
    uStack_320 = 0;
    local_338 = local_438[5];
    local_788 = local_438[6];
    local_318 = local_6c0[3];
    uStack_310 = 0;
    local_308 = local_438[2];
    uStack_300 = 0;
    dVar25 = exp(dVar52 * -6029.542089672155 + dVar24);
    dVar49 = local_818[7];
    dVar25 = dVar25 * 420000000.0;
    local_938 = local_898 * 6029.542089672155 + dVar27;
    local_1c8 = (local_838 + local_838 + local_7b8) - local_728;
    local_238 = exp(local_1c8);
    local_238 = dVar25 / local_238;
    uStack_230 = 0;
    local_7b8 = (local_880 + local_850) - (local_858 + local_858);
    dStack_7b0 = local_8a8;
    dVar40 = -local_238;
    local_3d0 = local_938 * dVar25;
    local_8a8 = dStack_960;
    uStack_8a0 = 0;
    local_208 = dVar49 * dVar40;
    uStack_200 = 0;
    local_1e8 = local_680 + local_208;
    local_3e0 = dVar25 + dVar25;
    local_3c8 = local_4f0;
    local_948 = dStack_4a8;
    local_3d8 = local_4a0;
    local_1f8 = local_438[7];
    local_8e8._0_8_ = exp(dVar52 * 819.8909135956303 + dVar24);
    auVar34._0_8_ = exp(local_1c8);
    dVar28 = local_818[3];
    auVar34._8_8_ = local_388;
    local_8e8._0_8_ = (double)local_8e8._0_8_ * 130000.0;
    local_8e8._8_8_ = local_378 * 28900000.0;
    auVar39._8_8_ = local_8e8._8_8_;
    auVar39._0_8_ = local_8e8._0_8_;
    auVar33 = divpd(auVar39,auVar34);
    dVar29 = dVar30 * -819.8909135956303 + local_368;
    dVar45 = dVar30 * -250.09868290494586 + dStack_360;
    dVar30 = local_7b8 * local_8b8;
    local_368 = (dVar29 - dVar30) * auVar33._0_8_;
    dStack_360 = (dVar45 - dStack_7b0 * dStack_8b0) * auVar33._8_8_;
    local_7b8 = -auVar33._0_8_;
    dStack_7b0 = -auVar33._8_8_;
    dVar26 = dStack_7b0 * local_218;
    local_660 = local_660 + dVar26;
    dStack_658 = dStack_658 + dVar26;
    local_388 = local_570;
    dStack_380 = dStack_568;
    local_378 = dStack_550;
    dStack_370 = dStack_548;
    local_640 = local_640 - dVar26;
    dStack_638 = dStack_638 - dVar26;
    dVar46 = (double)local_8e8._8_8_ * local_818[5];
    dVar37 = ((double)local_8e8._0_8_ + (double)local_8e8._0_8_) * local_818[6];
    local_500 = local_228 - dVar46;
    dVar38 = local_818[5] * local_7c8;
    dVar30 = local_938 - dVar30;
    local_928._0_8_ = (double)local_928._0_8_ * local_818[5];
    dVar26 = local_818[6] * local_818[6];
    local_938 = dVar49 * local_818[1];
    dStack_930 = local_218 * local_818[2];
    dVar42 = dVar25 * dVar26 - local_938 * local_238;
    dVar25 = dVar26 * local_3d0 - dVar30 * local_238 * local_938;
    dVar43 = local_818[6] * local_3e0;
    dVar40 = dVar40 * local_818[1];
    local_948 = local_948 - (dVar40 + dVar40);
    dStack_a10 = auVar10._8_8_;
    auVar16._4_8_ = 0x8000000000000000;
    auVar16._0_4_ = local_918._4_4_;
    auVar35._0_8_ = auVar16._0_8_ << 0x20;
    auVar35._8_4_ = (undefined4)uStack_910;
    auVar35._12_4_ = uStack_910._4_4_;
    local_928._8_4_ = SUB84(dVar26,0);
    local_928._12_4_ = (int)((ulong)dVar26 >> 0x20);
    local_798 = (double)local_928._0_8_ * (double)local_8e8._8_8_ + dStack_7b0 * dStack_930;
    dStack_790 = dStack_790 * auVar35._8_8_ + local_7c8 * dStack_a10;
    dStack_980 = dStack_980 - local_348;
    auVar15._8_4_ = SUB84(local_978 - dStack_790,0);
    auVar15._0_8_ = dStack_980;
    auVar15._12_4_ = (int)((ulong)(local_978 - dStack_790) >> 0x20);
    local_978 = auVar15._8_8_;
    dStack_970 = (dStack_790 + local_8f8) - local_798;
    local_968 = local_7a8 - dStack_790;
    local_998._8_8_ = local_798 + local_358 + dStack_790;
    local_988 = local_798 + local_988;
    uStack_910 = dStack_960;
    local_680 = dVar49 * local_7b8;
    dVar30 = local_818[2] * dStack_7b0;
    local_698._8_8_ = (local_2e8 + dVar38) - dVar30;
    local_698._0_8_ = local_780 - dVar38;
    dVar41 = local_818[6] * (double)local_8e8._8_8_;
    local_570 = local_570 + dVar41;
    dStack_568 = dStack_568 + dVar41;
    dStack_550 = dStack_550 - dVar41;
    dStack_548 = dStack_548 - dVar41;
    local_438[7] = dVar29 * (double)local_8e8._0_8_ * dVar26 - local_368 * local_938;
    dVar26 = dVar45 * (double)local_8e8._8_8_ * (double)local_928._0_8_ - dStack_360 * dStack_930;
    local_438[5] = local_338 - dVar26;
    local_6c0[2] = local_2f8 + dVar38 + dVar30 + local_208 + local_680;
    local_6c0[3] = local_318 + dVar30;
    local_688 = (((dVar36 - dVar38) - dVar30) - (local_208 + local_208)) - (local_680 + local_680);
    local_680 = local_680 + local_1e8;
    dStack_520 = dVar37 + local_1d8 + dVar46 + dVar43;
    local_518 = dVar46 + local_3a8;
    local_4f0 = local_3c8 + dVar43 + dVar37;
    dStack_4f8 = ((local_3b8 - dVar46) - (dVar43 + dVar43)) - (dVar37 + dVar37);
    local_818[1] = local_818[1] * local_7b8;
    local_4d0 = local_4d0 + dVar40 + local_818[1];
    local_4a0 = dVar40 + local_3d8 + local_818[1];
    dStack_4a8 = local_948 - (local_818[1] + local_818[1]);
    local_8a8 = local_8a8 + dVar42;
    local_438[1] = local_328 + dVar26 + dVar25 + local_438[7];
    local_438[2] = local_308 + dVar26;
    local_438[6] = ((local_788 - dVar26) - (dVar25 + dVar25)) - (local_438[7] + local_438[7]);
    local_7a8 = (double)local_998._8_8_ + dVar42;
    dStack_7a0 = 0.0;
    local_438[7] = local_438[7] + local_1f8 + dVar25;
    dVar49 = dVar49 * local_818[3];
    local_918 = local_968;
    local_7c8 = exp(dVar24 + dVar52 * -1997.7701632447386);
    dVar26 = local_818[5];
    local_7c8 = local_7c8 * 24100000.0;
    dVar29 = local_898 * 1997.7701632447386;
    local_8f8 = dVar27 + dVar29;
    dStack_8f0 = 0.0;
    local_948 = local_818[2];
    dVar30 = local_818[2] * local_818[5];
    dVar36 = exp((local_1c0 - dVar44) + local_728);
    dVar25 = local_8f8 * local_7c8 * dVar49 -
             (local_8f8 - ((local_878 + dStack_860) - (local_870 + local_850)) * dVar52) *
             (local_7c8 / dVar36) * dVar30;
    dVar36 = -(local_7c8 / dVar36);
    dVar40 = (double)local_928._8_8_ * (double)local_8e8._0_8_ + local_7b8 * local_938;
    dStack_960 = dVar49 * local_7c8 + dVar36 * dVar30;
    local_988 = local_988 + dStack_960;
    dStack_980 = dStack_980 - dStack_960;
    dStack_970 = dStack_970 + dStack_960;
    dStack_960 = (local_8a8 + dVar40) - dStack_960;
    local_968 = ((local_918 - local_798) - (dVar42 + dVar42)) - (dVar40 + dVar40);
    dVar26 = dVar26 * dVar36;
    dStack_658 = dStack_658 + dVar26;
    local_650 = local_650 - dVar26;
    local_640 = local_640 + dVar26;
    local_630 = local_630 - dVar26;
    dVar26 = local_7c8 * local_818[7];
    local_608 = local_608 + dVar26;
    dStack_600 = dStack_600 - dVar26;
    dStack_5f0 = dStack_5f0 + dVar26;
    local_5e0 = local_5e0 - dVar26;
    dVar36 = dVar36 * local_948;
    dStack_568 = dStack_568 + dVar36;
    local_560 = local_560 - dVar36;
    dStack_550 = dStack_550 + dVar36;
    local_540 = local_540 - dVar36;
    dVar26 = local_7c8 * dVar28;
    local_4c8 = local_4c8 + dVar26;
    local_4c0 = local_4c0 - dVar26;
    local_4b0 = local_4b0 + dVar26;
    local_4a0 = local_4a0 - dVar26;
    local_438[2] = local_438[2] + dVar25;
    local_438[3] = local_438[3] - dVar25;
    local_438[5] = local_438[5] + dVar25;
    local_438[7] = local_438[7] - dVar25;
    local_8a8 = local_818[7] * dVar28;
    local_998._8_8_ = local_7a8 + dVar40;
    local_918 = exp(dVar52 * -4000.5724931475243 + dVar24);
    dVar28 = local_818[6];
    local_918 = local_918 * 48200000.0;
    local_798 = local_898 * 4000.5724931475243 + dVar27;
    local_928._0_8_ = local_818[0] * local_818[6];
    dVar49 = exp(((local_a30 - local_718) - local_838) + local_728);
    dVar26 = local_818[7];
    dVar49 = local_918 / dVar49;
    dVar30 = local_918 * local_8a8 - (double)local_928._0_8_ * dVar49;
    dVar25 = local_798 * local_918 * local_8a8 -
             (local_798 - ((local_888 + local_858) - (local_870 + local_850)) * dVar52) * dVar49 *
             (double)local_928._0_8_;
    local_998._0_8_ = (double)local_998._0_8_ + dVar30;
    dStack_980 = dStack_980 - dVar30;
    dStack_960 = dStack_960 - dVar30;
    local_968 = dVar30 + local_968;
    dVar28 = dVar28 * -dVar49;
    local_708[0] = local_708[0] + dVar28;
    local_708[3] = local_708[3] - dVar28;
    local_708[6] = local_708[6] + dVar28;
    local_708[7] = local_708[7] - dVar28;
    dVar28 = local_918 * local_818[7];
    local_618 = local_618 + dVar28;
    dStack_600 = dStack_600 - dVar28;
    local_5e8 = local_5e8 + dVar28;
    local_5e0 = local_5e0 - dVar28;
    local_818[0] = -dVar49 * local_818[0];
    local_528 = local_528 + local_818[0];
    dStack_4f8 = dStack_4f8 + local_818[0];
    local_4f0 = local_4f0 - local_818[0];
    local_818[3] = local_918 * local_818[3];
    local_4d8 = local_4d8 + local_818[3];
    local_4c0 = local_4c0 - local_818[3];
    dStack_4a8 = dStack_4a8 + local_818[3];
    local_4a0 = local_4a0 - local_818[3];
    local_438[0] = local_438[0] + dVar25;
    local_438[3] = local_438[3] - dVar25;
    local_438[6] = local_438[6] + dVar25;
    local_438[7] = local_438[7] - dVar25;
    dVar30 = local_818[7] * local_818[4];
    local_510._0_8_ = (double)local_510._0_8_ - local_818[0];
    dVar28 = exp(local_188 + dVar52 * -1997.7701632447386);
    dVar25 = local_818[5];
    local_928._8_8_ = extraout_XMM0_Qb_00;
    local_928._0_8_ = dVar28 * 9.55;
    local_8c8._0_8_ = (double)local_8c8._0_8_ + dVar29;
    local_718 = local_818[6];
    dStack_710 = 0.0;
    local_8a8 = local_818[5] * local_818[6];
    dVar28 = exp(((local_9d0 - dVar44) - local_838) + local_728);
    dVar28 = (double)local_928._0_8_ / dVar28;
    dVar49 = (double)local_928._0_8_ * dVar30 - local_8a8 * dVar28;
    dVar29 = (double)local_8c8._0_8_ * (double)local_928._0_8_ * dVar30 -
             ((double)local_8c8._0_8_ -
             ((dStack_860 + local_858) - (local_868 + local_850)) * dVar52) * dVar28 * local_8a8;
    local_978 = local_978 - dVar49;
    dStack_970 = dVar49 + dStack_970;
    local_968 = dVar49 + local_968;
    dStack_960 = dStack_960 - dVar49;
    dVar49 = (double)local_928._0_8_ * dVar26;
    local_5a8 = local_5a8 - dVar49;
    dStack_5a0 = dVar49 + dStack_5a0;
    local_598 = dVar49 + local_598;
    local_590 = local_590 - dVar49;
    dVar49 = local_718 * -dVar28;
    dStack_558 = dStack_558 - dVar49;
    dStack_550 = dVar49 + dStack_550;
    dStack_548 = dVar49 + dStack_548;
    local_540 = local_540 - dVar49;
    dVar28 = -dVar28 * dVar25;
    local_510._8_8_ = (double)local_510._8_8_ - dVar28;
    local_500 = dVar28 + local_500;
    dStack_4f8 = dVar28 + dStack_4f8;
    local_4f0 = local_4f0 - dVar28;
    local_818[4] = (double)local_928._0_8_ * local_818[4];
    local_4b8 = local_4b8 - local_818[4];
    local_4b0 = local_818[4] + local_4b0;
    dStack_4a8 = local_818[4] + dStack_4a8;
    local_4a0 = local_4a0 - local_818[4];
    local_438[4] = local_438[4] - dVar29;
    local_438[5] = dVar29 + local_438[5];
    local_438[6] = dVar29 + local_438[6];
    local_438[7] = local_438[7] - dVar29;
    dVar26 = dVar26 * dVar25;
    local_900 = exp(local_900);
    dVar49 = local_818[6];
    dVar28 = local_818[2];
    local_900 = local_900 * 1000000.0;
    dVar25 = local_818[2] * local_818[6];
    dVar29 = ((dVar44 - local_820) - local_838) + local_728;
    dVar30 = exp(dVar29);
    dVar44 = local_818[5];
    dVar30 = local_900 / dVar30;
    dVar36 = local_900 * dVar26 - dVar25 * dVar30;
    dVar25 = dStack_8d0 * local_900 * dVar26 -
             (dStack_8d0 - ((local_878 + local_858) - (dStack_860 + local_850)) * dVar52) * dVar30 *
             dVar25;
    local_988 = local_988 + dVar36;
    dStack_970 = dStack_970 - dVar36;
    dStack_960 = dStack_960 - dVar36;
    local_968 = dVar36 + local_968;
    dVar49 = dVar49 * -dVar30;
    dStack_658 = dStack_658 + dVar49;
    local_640 = local_640 - dVar49;
    dStack_638 = dStack_638 + dVar49;
    local_630 = local_630 - dVar49;
    local_838 = local_818[7];
    dVar26 = local_900 * local_818[7];
    dStack_568 = dStack_568 + dVar26;
    dStack_550 = dStack_550 - dVar26;
    dStack_548 = dStack_548 + dVar26;
    local_540 = local_540 - dVar26;
    dVar28 = -dVar30 * dVar28;
    local_518 = local_518 + dVar28;
    local_500 = local_500 - dVar28;
    dStack_4f8 = dStack_4f8 + dVar28;
    local_4f0 = local_4f0 - dVar28;
    dVar26 = local_900 * local_818[5];
    local_4c8 = local_4c8 + dVar26;
    local_4b0 = local_4b0 - dVar26;
    dStack_4a8 = dStack_4a8 + dVar26;
    local_4a0 = local_4a0 - dVar26;
    local_438[2] = local_438[2] + dVar25;
    local_438[5] = local_438[5] - dVar25;
    local_438[6] = local_438[6] + dVar25;
    local_438[7] = local_438[7] - dVar25;
    dVar24 = exp(dVar52 * -4809.241675095709 + dVar24);
    dVar25 = exp(dVar29);
    dVar24 = dVar24 * 580000000.0;
    dVar27 = local_898 * 4809.241675095709 + dVar27;
    dVar25 = dVar24 / dVar25;
    dVar26 = dVar24 * local_838 * dVar44 - local_818[2] * local_818[6] * dVar25;
    dVar27 = dVar27 * dVar24 * local_838 * dVar44 -
             (dVar27 - ((local_878 + local_858) - (dStack_860 + local_850)) * dVar52) * dVar25 *
             local_818[2] * local_818[6];
    local_988 = local_988 + dVar26;
    dStack_970 = dStack_970 - dVar26;
    local_968 = dVar26 + local_968;
    dStack_960 = dStack_960 - dVar26;
    local_818[6] = local_818[6] * -dVar25;
    dStack_658 = dStack_658 + local_818[6];
    local_640 = local_640 - local_818[6];
    dStack_638 = dStack_638 + local_818[6];
    local_630 = local_630 - local_818[6];
    local_818[7] = local_818[7] * dVar24;
    dStack_568 = dStack_568 + local_818[7];
    dStack_550 = dStack_550 - local_818[7];
    dStack_548 = dStack_548 + local_818[7];
    local_540 = local_540 - local_818[7];
    local_818[2] = -dVar25 * local_818[2];
    local_518 = local_518 + local_818[2];
    local_500 = local_500 - local_818[2];
    dStack_4f8 = dStack_4f8 + local_818[2];
    local_4f0 = local_4f0 - local_818[2];
    dVar24 = dVar24 * local_818[5];
    local_4c8 = local_4c8 + dVar24;
    local_4b0 = local_4b0 - dVar24;
    dStack_4a8 = dStack_4a8 + dVar24;
    local_4a0 = local_4a0 - dVar24;
    local_438[2] = local_438[2] + dVar27;
    local_438[5] = local_438[5] - dVar27;
    local_438[6] = local_438[6] + dVar27;
    local_438[7] = local_438[7] - dVar27;
    if (local_3bc == 2) {
      local_2c0 = local_1b8 * 0.0 + local_198 * 0.0 + local_1a8 * 0.0 + local_398 * 0.0 + 2.5;
      if (1000.0 <= local_398) {
        dVar24 = local_1b8 * -1.13643531e-15 +
                 local_198 * 1.77528148e-11 +
                 local_1a8 * -1.25884199e-07 + local_398 * 0.000613519689 + 3.69757819;
        local_2d8._8_4_ = SUB84(dVar24,0);
        local_2d8._0_8_ =
             local_1b8 * 1.58275179e-15 +
             local_198 * -9.23157818e-12 +
             local_1a8 * -5.63382869e-08 + local_398 * 0.000700064411 + 2.99142337;
        local_2d8._12_4_ = (int)((ulong)dVar24 >> 0x20);
        local_2c8 = local_1b8 * -6.39161787e-15 +
                    local_198 * 1.20099639e-10 +
                    local_1a8 * -8.73026011e-07 + local_398 * 0.00305629289 + 2.67214561;
        local_2b8 = local_1b8 * -4.3680515e-16 +
                    local_198 * 4.55106742e-12 +
                    local_1a8 * -3.10280335e-09 + local_398 * -2.75506191e-05 + 2.54205966;
        dStack_2b0 = local_1b8 * -1.33195876e-15 +
                     local_198 * 3.05218674e-11 +
                     local_1a8 * -2.59082758e-07 + local_398 * 0.00105650448 + 2.86472886;
        dVar24 = local_1b8 * -1.43165356e-14 +
                 local_198 * 2.34890357e-10 +
                 local_1a8 * -1.47468882e-06 + local_398 * 0.00433613639 + 4.57316685;
        local_2a8._8_4_ = SUB84(dVar24,0);
        local_2a8._0_8_ =
             local_1b8 * -1.07908535e-14 +
             local_198 * 1.1424637e-10 +
             local_1a8 * -6.3365815e-07 + local_398 * 0.00223982013 + 4.0172109;
        local_2a8._12_4_ = (int)((ulong)dVar24 >> 0x20);
        local_298 = local_1b8 * -6.753351e-15 +
                    local_198 * 1.009704e-10 +
                    local_1a8 * -5.684761e-07 + local_398 * 0.001487977 + 2.92664;
        local_288[0] = local_198 * 6.33100716e-15 +
                       local_1a8 * -2.76947345e-11 + local_398 * -1.12676574e-07 + 0.000700064411;
        local_288[1] = local_198 * -4.54574124e-15 +
                       local_1a8 * 5.32584444e-11 + local_398 * -2.51768398e-07 + 0.000613519689;
        local_288[2] = local_198 * -2.55664715e-14 +
                       local_1a8 * 3.60298917e-10 + local_398 * -1.74605202e-06 + 0.00305629289;
        local_288[3] = local_198 * 0.0 + local_1a8 * 0.0 + local_398 * 0.0 + 0.0;
        local_268._8_8_ =
             local_198 * -5.32783504e-15 +
             local_1a8 * 9.15656022e-11 + local_398 * -5.18165516e-07 + 0.00105650448;
        local_268._0_8_ =
             local_198 * -1.7472206e-15 +
             local_1a8 * 1.36532023e-11 + local_398 * -6.2056067e-09 + -2.75506191e-05;
        local_258._8_8_ =
             local_198 * -5.72661424e-14 +
             local_1a8 * 7.04671071e-10 + local_398 * -2.94937764e-06 + 0.00433613639;
        local_258._0_8_ =
             local_198 * -4.3163414e-14 +
             local_1a8 * 3.4273911e-10 + local_398 * -1.2673163e-06 + 0.00223982013;
        dVar24 = local_1a8 * 3.029112e-10 + local_398 * -1.1369522e-06 + 0.001487977;
        dVar25 = local_198 * -2.7013404e-14;
      }
      else {
        dVar24 = local_1b8 * -8.76855392e-13 +
                 local_198 * 1.31387723e-09 +
                 local_1a8 * -5.75615047e-07 + local_398 * 0.00112748635 + 3.2129364;
        local_2d8._8_4_ = SUB84(dVar24,0);
        local_2d8._0_8_ =
             local_1b8 * 4.13487224e-13 +
             local_198 * -9.47543433e-11 +
             local_1a8 * -8.14301529e-07 + local_398 * 0.000824944174 + 3.29812431;
        local_2d8._12_4_ = (int)((ulong)dVar24 >> 0x20);
        local_2c8 = local_1b8 * -2.50658847e-12 +
                    local_198 * 6.96858127e-09 +
                    local_1a8 * -6.35469633e-06 + local_398 * 0.00347498246 + 3.38684249;
        local_2b8 = local_1b8 * 3.89069636e-13 +
                    local_198 * -1.60284319e-09 +
                    local_1a8 * 2.4210317e-06 + local_398 * -0.00163816649 + 2.94642878;
        dStack_2b0 = local_1b8 * 2.06237379e-12 +
                     local_198 * -5.79853643e-09 +
                     local_1a8 * 6.52764691e-06 + local_398 * -0.00322544939 + 4.12530561;
        dVar24 = local_1b8 * 2.47151475e-12 +
                 local_198 * -4.62580552e-09 +
                 local_1a8 * -1.48501258e-07 + local_398 * 0.00656922581 + 3.38875365;
        local_2a8._8_4_ = SUB84(dVar24,0);
        local_2a8._0_8_ =
             local_1b8 * 9.29225124e-12 +
             local_198 * -2.42763894e-08 +
             local_1a8 * 2.11582891e-05 + local_398 * -0.00474912051 + 4.30179801;
        local_2a8._12_4_ = (int)((ulong)dVar24 >> 0x20);
        local_298 = local_1b8 * -2.444855e-12 +
                    local_198 * 5.641515e-09 +
                    local_1a8 * -3.963222e-06 + local_398 * 0.00140824 + 3.298677;
        local_288[0] = local_198 * 1.6539489e-12 +
                       local_1a8 * -2.8426303e-10 + local_398 * -1.62860306e-06 + 0.000824944174;
        local_288[1] = local_198 * -3.50742157e-12 +
                       local_1a8 * 3.94163169e-09 + local_398 * -1.15123009e-06 + 0.00112748635;
        local_288[2] = local_198 * -1.00263539e-11 +
                       local_1a8 * 2.09057438e-08 + local_398 * -1.27093927e-05 + 0.00347498246;
        local_288[3] = local_198 * 0.0 + local_1a8 * 0.0 + local_398 * 0.0 + 0.0;
        local_268._8_8_ =
             local_198 * 8.24949516e-12 +
             local_1a8 * -1.73956093e-08 + local_398 * 1.30552938e-05 + -0.00322544939;
        local_268._0_8_ =
             local_198 * 1.55627854e-12 +
             local_1a8 * -4.80852957e-09 + local_398 * 4.8420634e-06 + -0.00163816649;
        local_258._8_8_ =
             local_198 * 9.886059e-12 +
             local_1a8 * -1.38774166e-08 + local_398 * -2.97002516e-07 + 0.00656922581;
        local_258._0_8_ =
             local_198 * 3.7169005e-11 +
             local_1a8 * -7.28291682e-08 + local_398 * 4.23165782e-05 + -0.00474912051;
        dVar24 = local_1a8 * 1.6924545e-08 + local_398 * -7.926444e-06 + 0.00140824;
        dVar25 = local_198 * -9.77942e-12;
      }
      dVar25 = dVar25 + dVar24;
      pdVar19 = &local_888;
      pdVar21 = local_248;
    }
    else {
      local_2c0 = local_1b8 * 0.0 + local_198 * 0.0 + local_1a8 * 0.0 + local_398 * 0.0 + 1.5;
      if (1000.0 <= local_398) {
        local_2d8._8_8_ =
             local_1b8 * -1.13643531e-15 +
             local_198 * 1.77528148e-11 +
             local_1a8 * -1.25884199e-07 + local_398 * 0.000613519689 + 2.69757819;
        local_2d8._0_8_ =
             local_1b8 * 1.58275179e-15 +
             local_198 * -9.23157818e-12 +
             local_1a8 * -5.63382869e-08 + local_398 * 0.000700064411 + 1.99142337;
        local_2c8 = local_1b8 * -6.39161787e-15 +
                    local_198 * 1.20099639e-10 +
                    local_1a8 * -8.73026011e-07 + local_398 * 0.00305629289 + 1.67214561;
        local_2b8 = local_1b8 * -4.3680515e-16 +
                    local_198 * 4.55106742e-12 +
                    local_1a8 * -3.10280335e-09 + local_398 * -2.75506191e-05 + 1.54205966;
        dStack_2b0 = local_1b8 * -1.33195876e-15 +
                     local_198 * 3.05218674e-11 +
                     local_1a8 * -2.59082758e-07 + local_398 * 0.00105650448 + 1.86472886;
        local_2a8._8_8_ =
             local_1b8 * -1.43165356e-14 +
             local_198 * 2.34890357e-10 +
             local_1a8 * -1.47468882e-06 + local_398 * 0.00433613639 + 3.57316685;
        local_2a8._0_8_ =
             local_1b8 * -1.07908535e-14 +
             local_198 * 1.1424637e-10 +
             local_1a8 * -6.3365815e-07 + local_398 * 0.00223982013 + 3.0172109;
        local_298 = local_1b8 * -6.753351e-15 +
                    local_198 * 1.009704e-10 +
                    local_1a8 * -5.684761e-07 + local_398 * 0.001487977 + 1.92664;
        local_288[0] = local_198 * 6.33100716e-15 +
                       local_1a8 * -2.76947345e-11 + local_398 * -1.12676574e-07 + 0.000700064411;
        local_288[1] = local_198 * -4.54574124e-15 +
                       local_1a8 * 5.32584444e-11 + local_398 * -2.51768398e-07 + 0.000613519689;
        local_288[2] = local_198 * -2.55664715e-14 +
                       local_1a8 * 3.60298917e-10 + local_398 * -1.74605202e-06 + 0.00305629289;
        local_288[3] = local_198 * 0.0 + local_1a8 * 0.0 + local_398 * 0.0 + 0.0;
        dVar24 = local_198 * -5.32783504e-15 +
                 local_1a8 * 9.15656022e-11 + local_398 * -5.18165516e-07 + 0.00105650448;
        local_268._8_4_ = SUB84(dVar24,0);
        local_268._0_8_ =
             local_198 * -1.7472206e-15 +
             local_1a8 * 1.36532023e-11 + local_398 * -6.2056067e-09 + -2.75506191e-05;
        local_268._12_4_ = (int)((ulong)dVar24 >> 0x20);
        dVar24 = local_198 * -5.72661424e-14 +
                 local_1a8 * 7.04671071e-10 + local_398 * -2.94937764e-06 + 0.00433613639;
        local_258._8_4_ = SUB84(dVar24,0);
        local_258._0_8_ =
             local_198 * -4.3163414e-14 +
             local_1a8 * 3.4273911e-10 + local_398 * -1.2673163e-06 + 0.00223982013;
        local_258._12_4_ = (int)((ulong)dVar24 >> 0x20);
        local_248[0] = local_198 * -2.7013404e-14 +
                       local_1a8 * 3.029112e-10 + local_398 * -1.1369522e-06 + 0.001487977;
        dVar24 = dStack_8b0 * -1233.93018 +
                 local_1b8 * -2.27287062e-16 +
                 local_198 * 4.4382037e-12 +
                 local_1a8 * -4.19613997e-08 + local_398 * 0.000306759845 + 2.69757819;
        local_78._8_4_ = SUB84(dVar24,0);
        local_78._0_8_ =
             local_8b8 * -835.033997 +
             local_1b8 * 3.16550358e-16 +
             local_198 * -2.30789455e-12 +
             local_1a8 * -1.8779429e-08 + local_398 * 0.000350032206 + 1.99142337;
        local_78._12_4_ = (int)((ulong)dVar24 >> 0x20);
        local_68 = local_8b8 * -29899.209 +
                   local_1b8 * -1.27832357e-15 +
                   local_198 * 3.00249098e-11 +
                   local_1a8 * -2.9100867e-07 + local_398 * 0.00152814644 + 1.67214561;
        dStack_60 = dStack_8b0 * 25471.627 + local_2c0;
        local_58 = local_8b8 * 29230.8027 +
                   local_1b8 * -8.736103e-17 +
                   local_198 * 1.13776685e-12 +
                   local_1a8 * -1.03426778e-09 + local_398 * -1.37753096e-05 + 1.54205966;
        dStack_50 = dStack_8b0 * 3683.62875 +
                    local_1b8 * -2.66391752e-16 +
                    local_198 * 7.63046685e-12 +
                    local_1a8 * -8.63609193e-08 + local_398 * 0.00052825224 + 1.86472886;
        local_48 = local_8b8 * 111.856713 +
                   local_1b8 * -2.1581707e-15 +
                   local_198 * 2.85615925e-11 +
                   local_1a8 * -2.11219383e-07 + local_398 * 0.00111991006 + 3.0172109;
        dStack_40 = dStack_8b0 * -18006.9609 +
                    local_1b8 * -2.86330712e-15 +
                    local_198 * 5.87225893e-11 +
                    local_1a8 * -4.9156294e-07 + local_398 * 0.0021680682 + 3.57316685;
        dVar25 = local_1b8 * -1.3506702e-15 +
                 local_198 * 2.52426e-11 +
                 local_1a8 * -1.89492033e-07 + local_398 * 0.0007439885 + 1.92664;
        dVar24 = -922.7977;
      }
      else {
        local_2d8._8_8_ =
             local_1b8 * -8.76855392e-13 +
             local_198 * 1.31387723e-09 +
             local_1a8 * -5.75615047e-07 + local_398 * 0.00112748635 + 2.2129364;
        local_2d8._0_8_ =
             local_1b8 * 4.13487224e-13 +
             local_198 * -9.47543433e-11 +
             local_1a8 * -8.14301529e-07 + local_398 * 0.000824944174 + 2.29812431;
        local_2c8 = local_1b8 * -2.50658847e-12 +
                    local_198 * 6.96858127e-09 +
                    local_1a8 * -6.35469633e-06 + local_398 * 0.00347498246 + 2.38684249;
        local_2b8 = local_1b8 * 3.89069636e-13 +
                    local_198 * -1.60284319e-09 +
                    local_1a8 * 2.4210317e-06 + local_398 * -0.00163816649 + 1.94642878;
        dStack_2b0 = local_1b8 * 2.06237379e-12 +
                     local_198 * -5.79853643e-09 +
                     local_1a8 * 6.52764691e-06 + local_398 * -0.00322544939 + 3.12530561;
        local_2a8._8_8_ =
             local_1b8 * 2.47151475e-12 +
             local_198 * -4.62580552e-09 +
             local_1a8 * -1.48501258e-07 + local_398 * 0.00656922581 + 2.38875365;
        local_2a8._0_8_ =
             local_1b8 * 9.29225124e-12 +
             local_198 * -2.42763894e-08 +
             local_1a8 * 2.11582891e-05 + local_398 * -0.00474912051 + 3.30179801;
        local_298 = local_1b8 * -2.444855e-12 +
                    local_198 * 5.641515e-09 +
                    local_1a8 * -3.963222e-06 + local_398 * 0.00140824 + 2.298677;
        local_288[0] = local_198 * 1.6539489e-12 +
                       local_1a8 * -2.8426303e-10 + local_398 * -1.62860306e-06 + 0.000824944174;
        local_288[1] = local_198 * -3.50742157e-12 +
                       local_1a8 * 3.94163169e-09 + local_398 * -1.15123009e-06 + 0.00112748635;
        local_288[2] = local_198 * -1.00263539e-11 +
                       local_1a8 * 2.09057438e-08 + local_398 * -1.27093927e-05 + 0.00347498246;
        local_288[3] = local_198 * 0.0 + local_1a8 * 0.0 + local_398 * 0.0 + 0.0;
        dVar24 = local_198 * 8.24949516e-12 +
                 local_1a8 * -1.73956093e-08 + local_398 * 1.30552938e-05 + -0.00322544939;
        local_268._8_4_ = SUB84(dVar24,0);
        local_268._0_8_ =
             local_198 * 1.55627854e-12 +
             local_1a8 * -4.80852957e-09 + local_398 * 4.8420634e-06 + -0.00163816649;
        local_268._12_4_ = (int)((ulong)dVar24 >> 0x20);
        dVar24 = local_198 * 9.886059e-12 +
                 local_1a8 * -1.38774166e-08 + local_398 * -2.97002516e-07 + 0.00656922581;
        local_258._8_4_ = SUB84(dVar24,0);
        local_258._0_8_ =
             local_198 * 3.7169005e-11 +
             local_1a8 * -7.28291682e-08 + local_398 * 4.23165782e-05 + -0.00474912051;
        local_258._12_4_ = (int)((ulong)dVar24 >> 0x20);
        local_248[0] = local_198 * -9.77942e-12 +
                       local_1a8 * 1.6924545e-08 + local_398 * -7.926444e-06 + 0.00140824;
        dVar24 = dStack_8b0 * -1005.24902 +
                 local_1b8 * -1.75371078e-13 +
                 local_198 * 3.28469308e-10 +
                 local_1a8 * -1.91871682e-07 + local_398 * 0.000563743175 + 2.2129364;
        local_78._8_4_ = SUB84(dVar24,0);
        local_78._0_8_ =
             local_8b8 * -1012.52087 +
             local_1b8 * 8.26974448e-14 +
             local_198 * -2.36885858e-11 +
             local_1a8 * -2.71433843e-07 + local_398 * 0.000412472087 + 2.29812431;
        local_78._12_4_ = (int)((ulong)dVar24 >> 0x20);
        local_68 = local_8b8 * -30208.1133 +
                   local_1b8 * -5.01317694e-13 +
                   local_198 * 1.74214532e-09 +
                   local_1a8 * -2.11823211e-06 + local_398 * 0.00173749123 + 2.38684249;
        dStack_60 = dStack_8b0 * 25471.627 + local_2c0;
        local_58 = local_8b8 * 29147.6445 +
                   local_1b8 * 7.78139272e-14 +
                   local_198 * -4.00710797e-10 +
                   local_1a8 * 8.07010567e-07 + local_398 * -0.000819083245 + 1.94642878;
        dStack_50 = dStack_8b0 * 3346.30913 +
                    local_1b8 * 4.12474758e-13 +
                    local_198 * -1.44963411e-09 +
                    local_1a8 * 2.1758823e-06 + local_398 * -0.0016127247 + 3.12530561;
        local_48 = local_8b8 * 294.80804 +
                   local_1b8 * 1.85845025e-12 +
                   local_198 * -6.06909735e-09 +
                   local_1a8 * 7.05276303e-06 + local_398 * -0.00237456025 + 3.30179801;
        dStack_40 = dStack_8b0 * -17663.1465 +
                    local_1b8 * 4.9430295e-13 +
                    local_198 * -1.15645138e-09 +
                    local_1a8 * -4.95004193e-08 + local_398 * 0.0032846129 + 2.38875365;
        dVar25 = local_1b8 * -4.88971e-13 +
                 local_198 * 1.41037875e-09 +
                 local_1a8 * -1.321074e-06 + local_398 * 0.00070412 + 2.298677;
        dVar24 = -1020.9;
      }
      pdVar19 = (double *)local_78;
      dVar25 = dVar24 * dVar52 + dVar25;
      pdVar21 = &local_38;
    }
    *pdVar21 = dVar25;
    dVar25 = 0.0;
    dVar26 = 0.0;
    dVar24 = 0.0;
    lVar20 = 0;
    dVar27 = 0.0;
    do {
      dVar27 = dVar27 + *(double *)(local_2d8 + lVar20) * *(double *)((long)local_818 + lVar20);
      dVar28 = *(double *)((long)pdVar19 + lVar20);
      dVar25 = dVar25 + *(double *)((long)local_818 + lVar20) *
                        *(double *)((long)local_288 + lVar20);
      dVar26 = dVar26 + *(double *)(local_998 + lVar20) * dVar28;
      dVar24 = dVar24 + (*(double *)(local_2d8 + lVar20) - dVar28) * dVar52 *
                        *(double *)(local_998 + lVar20) +
                        dVar28 * *(double *)((long)local_438 + lVar20);
      lVar20 = lVar20 + 8;
    } while (lVar20 != 0x48);
    dVar26 = dVar26 * (1.0 / dVar27);
    dVar27 = local_398 * (1.0 / dVar27);
    dVar52 = dVar26 * dVar27;
    dVar27 = -dVar27;
    pdVar21 = local_708;
    pdVar22 = local_6c0;
    lVar20 = 0;
    do {
      dVar28 = 0.0;
      lVar23 = 0;
      do {
        dVar28 = dVar28 + pdVar19[lVar23] * pdVar21[lVar23];
        lVar23 = lVar23 + 1;
      } while (lVar23 != 9);
      local_6c0[lVar20 * 10] = *(double *)(local_2d8 + lVar20 * 8) * dVar52 + dVar28 * dVar27;
      lVar20 = lVar20 + 1;
      pdVar21 = pdVar21 + 10;
    } while (lVar20 != 9);
    local_3f0[0] = dVar27 * dVar24 + (dVar52 * dVar25 - dVar26);
    lVar20 = -9;
    do {
      local_3f0[lVar20] = local_3f0[lVar20] * 1e-06;
      *pdVar22 = *pdVar22 * 1000000.0;
      pdVar22 = pdVar22 + 10;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 0);
    SUNDlsMat_denseScale(0.0,*(realtype ***)*puVar4,10,10);
    a = *(realtype ***)*puVar4;
    lVar20 = 0;
    pdVar19 = local_708;
    do {
      dVar24 = local_168[lVar20];
      lVar23 = 0;
      pdVar21 = pdVar19;
      do {
        a[lVar23][lVar20] = (*pdVar21 * dVar24) / local_168[lVar23];
        lVar23 = lVar23 + 1;
        pdVar21 = pdVar21 + 10;
      } while (lVar23 != 9);
      a[lVar20][9] = local_708[lVar20 * 10 + 9] / dVar24;
      lVar20 = lVar20 + 1;
      pdVar19 = pdVar19 + 1;
    } while (lVar20 != 9);
    prVar18 = a[9];
    lVar20 = 0;
    do {
      prVar18[lVar20] = local_438[lVar20] * local_168[lVar20];
      lVar20 = lVar20 + 1;
    } while (lVar20 != 9);
    prVar18[9] = local_3f0[0];
    SUNDlsMat_denseCopy(a,*(realtype ***)*puVar3,10,10);
    *jcurPtr = 1;
  }
  else {
    SUNDlsMat_denseCopy(*(realtype ***)*puVar4,*(realtype ***)*puVar3,10,10);
    *jcurPtr = 0;
  }
  SUNDlsMat_denseScale(-local_178,*(realtype ***)*puVar3,10,10);
  SUNDlsMat_denseAddIdentity(*(realtype ***)*puVar3,10);
  sVar17 = SUNDlsMat_denseGETRF(*(realtype ***)*puVar3,10,10,*(sunindextype **)*puVar5);
  return (int)(sVar17 != 0);
}

Assistant:

int
Precond(
  amrex::Real /* tn */,
  N_Vector u,
  N_Vector /* fu */,
  booleantype jok,
  booleantype* jcurPtr,
  amrex::Real gamma,
  void* user_data)
{
  BL_PROFILE("Pele::ReactorCvode::Precond()");
  // Make local copies of pointers to input data
  amrex::Real* u_d = N_VGetArrayPointer(u);

  // Make local copies of pointers in user_data
  auto* udata = static_cast<CVODEUserData*>(user_data);
  auto reactor_type = udata->reactor_type;
  auto* P = udata->P;
  auto* Jbd = udata->Jbd;
  auto* pivot = udata->pivot;

  // MW CGS
  amrex::Real mw[NUM_SPECIES] = {0.0};
  get_mw(mw);

  if (jok != 0) {
    // jok = SUNTRUE: Copy Jbd to P
    SUNDlsMat_denseCopy(Jbd[0][0], P[0][0], NUM_SPECIES + 1, NUM_SPECIES + 1);
    *jcurPtr = SUNFALSE;
  } else {
    // rho MKS
    amrex::Real rho = 0.0;
    for (int i = 0; i < NUM_SPECIES; i++) {
      rho = rho + u_d[i];
    }
    // Yks
    amrex::Real massfrac[NUM_SPECIES] = {0.0};
    amrex::Real rhoinv = 1.0 / rho;
    for (int i = 0; i < NUM_SPECIES; i++) {
      massfrac[i] = u_d[i] * rhoinv;
    }
    amrex::Real temp = u_d[NUM_SPECIES];
    // Activities
    amrex::Real activity[NUM_SPECIES] = {0.0};
    auto eos = pele::physics::PhysicsType::eos();
    eos.RTY2C(rho, temp, massfrac, activity);
    int consP = static_cast<int>(reactor_type == ReactorTypes::h_reactor_type);
    amrex::Real Jmat[(NUM_SPECIES + 1) * (NUM_SPECIES + 1)] = {0.0};
    DWDOT_SIMPLIFIED(Jmat, activity, &temp, &consP);

    // Scale Jacobian.  Load into P.
    SUNDlsMat_denseScale(0.0, Jbd[0][0], NUM_SPECIES + 1, NUM_SPECIES + 1);
    for (int i = 0; i < NUM_SPECIES; i++) {
      for (int k = 0; k < NUM_SPECIES; k++) {
        (Jbd[0][0])[k][i] = Jmat[k * (NUM_SPECIES + 1) + i] * mw[i] / mw[k];
      }
      (Jbd[0][0])[i][NUM_SPECIES] =
        Jmat[i * (NUM_SPECIES + 1) + NUM_SPECIES] / mw[i];
    }
    for (int i = 0; i < NUM_SPECIES; i++) {
      (Jbd[0][0])[NUM_SPECIES][i] =
        Jmat[NUM_SPECIES * (NUM_SPECIES + 1) + i] * mw[i];
    }
    (Jbd[0][0])[NUM_SPECIES][NUM_SPECIES] =
      Jmat[(NUM_SPECIES + 1) * (NUM_SPECIES + 1) - 1];

    SUNDlsMat_denseCopy(Jbd[0][0], P[0][0], NUM_SPECIES + 1, NUM_SPECIES + 1);

    *jcurPtr = SUNTRUE;
  }

  // Scale by -gamma
  SUNDlsMat_denseScale(-gamma, P[0][0], NUM_SPECIES + 1, NUM_SPECIES + 1);

  // Add identity matrix and do LU decompositions on blocks in place.
  SUNDlsMat_denseAddIdentity(P[0][0], NUM_SPECIES + 1);
  sunindextype ierr = SUNDlsMat_denseGETRF(
    P[0][0], NUM_SPECIES + 1, NUM_SPECIES + 1, pivot[0][0]);
  if (ierr != 0) {
    return (1);
  }

  return (0);
}